

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QGesture_*> operator&(QSet<QGesture_*> *lhs,QSet<QGesture_*> *rhs)

{
  long lVar1;
  QSet<QGesture_*> *in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QGesture_*>::QSet(in_RDX,(QSet<QGesture_*> *)in_RDI.d);
  QSet<QGesture_*>::operator&=(in_RDX,(QSet<QGesture_*> *)in_RDI.d);
  QSet<QGesture_*>::QSet(in_RDX,(QSet<QGesture_*> *)in_RDI.d);
  QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x30d8d5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSet<QGesture_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator&(const QSet &lhs, const QSet &rhs) { return QSet(lhs) &= rhs; }